

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_envelope.cxx
# Opt level: O1

void __thiscall xray_re::xr_key::save(xr_key *this,xr_writer *w)

{
  uint_fast32_t i;
  long lVar1;
  uint8_t local_21;
  float local_20;
  float local_1c;
  
  local_20 = this->value;
  (*w->_vptr_xr_writer[2])(w,&local_20,4);
  local_1c = this->time;
  (*w->_vptr_xr_writer[2])(w,&local_1c,4);
  local_21 = this->shape;
  (*w->_vptr_xr_writer[2])(w,&local_21,1);
  if (this->shape != '\x04') {
    xr_writer::w_float_q16(w,this->tension,-32.0,32.0);
    xr_writer::w_float_q16(w,this->continuity,-32.0,32.0);
    xr_writer::w_float_q16(w,this->bias,-32.0,32.0);
    lVar1 = 0;
    do {
      xr_writer::w_float_q16(w,this->param[lVar1],-32.0,32.0);
      lVar1 = lVar1 + 1;
    } while (lVar1 != 4);
  }
  return;
}

Assistant:

void xr_key::save(xr_writer& w) const
{
	w.w_float(value);
	w.w_float(time);
	w.w_u8(shape);
	if (shape != SHAPE_STEP) {
		w.w_float_q16(tension, -32.f, 32.f);
		w.w_float_q16(continuity, -32.f, 32.f);
		w.w_float_q16(bias, -32.f, 32.f);
		for (uint_fast32_t i = 0; i != 4; ++i)
			w.w_float_q16(param[i], -32.f, 32.f);
	}
}